

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall
CKey::SignCompact(CKey *this,uint256 *hash,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig)

{
  long lVar1;
  bool bVar2;
  value_type vVar3;
  int iVar4;
  reference pvVar5;
  char cVar6;
  uchar *in_RDX;
  secp256k1_context *in_RSI;
  secp256k1_ecdsa_recoverable_signature *in_RDI;
  long in_FS_OFFSET;
  int ret;
  int rec;
  secp256k1_pubkey rpk;
  secp256k1_pubkey epk;
  secp256k1_ecdsa_recoverable_signature rsig;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  size_type in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  size_type in_stack_fffffffffffffee0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff08;
  secp256k1_ecdsa_recoverable_signature *noncedata;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  int iVar7;
  undefined4 in_stack_ffffffffffffff34;
  secp256k1_pubkey *in_stack_ffffffffffffff38;
  secp256k1_context *in_stack_ffffffffffffff40;
  secp256k1_context *in_stack_ffffffffffffff48;
  secp256k1_pubkey *in_stack_ffffffffffffff50;
  secp256k1_context *in_stack_ffffffffffffff58;
  uchar *in_stack_ffffffffffffff80;
  secp256k1_ecdsa_recoverable_signature *in_stack_ffffffffffffff88;
  secp256k1_pubkey *in_stack_ffffffffffffff90;
  secp256k1_context *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  noncedata = in_RDI;
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  if (bVar2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    iVar7 = -1;
    base_blob<256U>::begin
              ((base_blob<256U> *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    begin((CKey *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    UCharCast((byte *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    iVar4 = secp256k1_ecdsa_sign_recoverable
                      (in_stack_ffffffffffffff48,
                       (secp256k1_ecdsa_recoverable_signature *)in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38->data,
                       (uchar *)CONCAT44(in_stack_ffffffffffffff34,iVar7),
                       (secp256k1_nonce_function)
                       CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),noncedata);
    if (iVar4 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x100,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed0);
    iVar4 = secp256k1_ecdsa_recoverable_signature_serialize_compact
                      (in_RSI,in_RDX,(int *)CONCAT44(iVar4,in_stack_ffffffffffffff08),in_RDI);
    if (iVar4 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x102,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    if (iVar7 == -1) {
      __assert_fail("rec != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x103,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    cVar6 = '\0';
    if ((in_RDI->data[0] & 1) != 0) {
      cVar6 = '\x04';
    }
    vVar3 = (char)iVar7 + '\x1b' + cVar6;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(vVar3,in_stack_fffffffffffffed8),in_stack_fffffffffffffed0);
    *pvVar5 = vVar3;
    begin((CKey *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    UCharCast((byte *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    iVar4 = secp256k1_ec_pubkey_create
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (uchar *)in_stack_ffffffffffffff48);
    if (iVar4 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x108,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    base_blob<256U>::begin
              ((base_blob<256U> *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    iVar4 = secp256k1_ecdsa_recover
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff80);
    if (iVar4 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x10a,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    iVar4 = secp256k1_ec_pubkey_cmp
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       (secp256k1_pubkey *)CONCAT44(in_stack_ffffffffffffff34,iVar7));
    if (iVar4 != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x10c,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::SignCompact(const uint256 &hash, std::vector<unsigned char>& vchSig) const {
    if (!keydata)
        return false;
    vchSig.resize(CPubKey::COMPACT_SIGNATURE_SIZE);
    int rec = -1;
    secp256k1_ecdsa_recoverable_signature rsig;
    int ret = secp256k1_ecdsa_sign_recoverable(secp256k1_context_sign, &rsig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, nullptr);
    assert(ret);
    ret = secp256k1_ecdsa_recoverable_signature_serialize_compact(secp256k1_context_sign, &vchSig[1], &rec, &rsig);
    assert(ret);
    assert(rec != -1);
    vchSig[0] = 27 + rec + (fCompressed ? 4 : 0);
    // Additional verification step to prevent using a potentially corrupted signature
    secp256k1_pubkey epk, rpk;
    ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &epk, UCharCast(begin()));
    assert(ret);
    ret = secp256k1_ecdsa_recover(secp256k1_context_static, &rpk, &rsig, hash.begin());
    assert(ret);
    ret = secp256k1_ec_pubkey_cmp(secp256k1_context_static, &epk, &rpk);
    assert(ret == 0);
    return true;
}